

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_pivot.cpp
# Opt level: O1

vector<duckdb::PivotColumn,_true> * __thiscall
duckdb::Transformer::TransformPivotList
          (vector<duckdb::PivotColumn,_true> *__return_storage_ptr__,Transformer *this,PGList *list,
          bool is_pivot)

{
  PGListCell *pPVar1;
  optional_ptr<duckdb_libpgquery::PGPivot,_true> pivot;
  optional_ptr<duckdb_libpgquery::PGPivot,_true> local_a8;
  undefined1 local_a0 [48];
  vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_> local_70;
  _Alloc_hider local_58;
  char local_48 [16];
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_38;
  
  (__return_storage_ptr__->super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>).
  super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>).
  super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>).
  super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar1 = list->head;
  if (pPVar1 != (PGListCell *)0x0) {
    do {
      local_a8.ptr = (PGPivot *)(pPVar1->data).ptr_value;
      optional_ptr<duckdb_libpgquery::PGPivot,_true>::CheckValid(&local_a8);
      TransformPivotColumn((PivotColumn *)local_a0,this,local_a8.ptr,is_pivot);
      ::std::vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>::
      emplace_back<duckdb::PivotColumn>
                (&__return_storage_ptr__->
                  super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>,
                 (PivotColumn *)local_a0);
      if (local_38._M_head_impl != (QueryNode *)0x0) {
        (*(local_38._M_head_impl)->_vptr_QueryNode[1])();
      }
      local_38._M_head_impl = (QueryNode *)0x0;
      if (local_58._M_p != local_48) {
        operator_delete(local_58._M_p);
      }
      ::std::vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>::~vector
                (&local_70);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_a0 + 0x18));
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)local_a0);
      pPVar1 = pPVar1->next;
    } while (pPVar1 != (PGListCell *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<PivotColumn> Transformer::TransformPivotList(duckdb_libpgquery::PGList &list, bool is_pivot) {
	vector<PivotColumn> result;
	for (auto node = list.head; node != nullptr; node = node->next) {
		auto pivot = PGPointerCast<duckdb_libpgquery::PGPivot>(node->data.ptr_value);
		result.push_back(TransformPivotColumn(*pivot, is_pivot));
	}
	return result;
}